

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

dictEntry * dictFind(dict *ht,void *key)

{
  _func_int_void_ptr_void_ptr_void_ptr *p_Var1;
  uint uVar2;
  int iVar3;
  dictEntry *pdVar4;
  
  if (ht->size != 0) {
    uVar2 = (*ht->type->hashFunction)(key);
    for (pdVar4 = ht->table[uVar2 & (uint)ht->sizemask]; pdVar4 != (dictEntry *)0x0;
        pdVar4 = pdVar4->next) {
      p_Var1 = ht->type->keyCompare;
      if (p_Var1 == (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
        if (pdVar4->key == key) {
          return pdVar4;
        }
      }
      else {
        iVar3 = (*p_Var1)(ht->privdata,key,pdVar4->key);
        if (iVar3 != 0) {
          return pdVar4;
        }
      }
    }
  }
  return (dictEntry *)0x0;
}

Assistant:

static dictEntry *dictFind(dict *ht, const void *key) {
    dictEntry *he;
    unsigned int h;

    if (ht->size == 0) return NULL;
    h = dictHashKey(ht, key) & ht->sizemask;
    he = ht->table[h];
    while(he) {
        if (dictCompareHashKeys(ht, key, he->key))
            return he;
        he = he->next;
    }
    return NULL;
}